

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satform.cpp
# Opt level: O1

void standard_form(expression *a)

{
  expression *in_RSI;
  
  reduce_associative(a);
  mathCore::recursive_standardize(a);
  mathCore::combine_and(a);
  mathCore::combine_or(a);
  mathCore::recursive_idempotent((mathCore *)a,in_RSI);
  return;
}

Assistant:

void standard_form(expression* a) {
	reduce_associative(a);
	mathCore::recursive_standardize(a);
	// Now you should be able to do this well
	mathCore::combine_and(a);
	mathCore::combine_or(a);
	mathCore::recursive_idempotent(a);
}